

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.h
# Opt level: O0

Name __thiscall wasm::Names::getValidName(Names *this,Name root,function<bool_(wasm::Name)> *check)

{
  Name __args;
  IString IVar1;
  bool bVar2;
  string_view local_e8;
  string local_d8;
  undefined1 local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  Index num;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> prefixed;
  function<bool_(wasm::Name)> *check_local;
  Name root_local;
  char *local_10;
  
  root_local.super_IString.str._M_len = root.super_IString.str._M_len;
  __args.super_IString.str._M_str = (char *)root_local.super_IString.str._M_len;
  __args.super_IString.str._M_len = (size_t)this;
  prefixed.field_2._8_8_ = this;
  check_local = (function<bool_(wasm::Name)> *)this;
  bVar2 = std::function<bool_(wasm::Name)>::operator()(root.super_IString.str._M_str,__args);
  if (bVar2) {
    root_local.super_IString.str._M_str = (char *)check_local;
    local_10 = (char *)root_local.super_IString.str._M_len;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_80,(basic_string_view<char,_std::char_traits<char>_> *)&check_local,
               &local_81);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   &local_80,'_');
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    name.field_2._8_4_ = 0;
    do {
      std::__cxx11::to_string(&local_d8,name.field_2._8_4_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     &local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      wasm::Name::Name((Name *)&local_e8,(string *)local_b8);
      bVar2 = std::function<bool_(wasm::Name)>::operator()
                        (root.super_IString.str._M_str,(Name)local_e8);
      if (bVar2) {
        wasm::Name::Name((Name *)&root_local.super_IString.str._M_str,(string *)local_b8);
      }
      else {
        name.field_2._8_4_ = name.field_2._8_4_ + 1;
      }
      std::__cxx11::string::~string((string *)local_b8);
    } while (!bVar2);
    std::__cxx11::string::~string((string *)local_60);
  }
  IVar1.str._M_str = local_10;
  IVar1.str._M_len = (size_t)root_local.super_IString.str._M_str;
  return (IString)(IString)IVar1.str;
}

Assistant:

inline Name getValidName(Name root, std::function<bool(Name)> check) {
  if (check(root)) {
    return root;
  }
  auto prefixed = std::string(root.str) + '_';
  Index num = 0;
  while (1) {
    auto name = prefixed + std::to_string(num);
    if (check(name)) {
      return name;
    }
    num++;
  }
}